

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_false>::delete_sib_(DaTrie<true,_true,_false> *this,uint32_t node_pos)

{
  byte bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  reference pvVar5;
  reference pvVar6;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t _node_pos;
  uint8_t label;
  uint32_t base;
  uint32_t parent_pos;
  uint local_1c;
  
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  uVar3 = Bc::check(pvVar5);
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
  uVar4 = Bc::base(pvVar5);
  pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)uVar3);
  bVar1 = pvVar6->child;
  while( true ) {
    local_1c = uVar4 ^ bVar1;
    pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)local_1c);
    if (pvVar6->sib == (byte)((byte)uVar4 ^ (byte)in_ESI)) break;
    pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)local_1c);
    bVar1 = pvVar6->sib;
  }
  pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)uVar3);
  uVar2 = pvVar6->child;
  pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)local_1c);
  if (uVar2 == pvVar6->sib) {
    pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)in_ESI);
    uVar2 = pvVar6->sib;
    pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                       ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                        (ulong)uVar3);
    pvVar6->child = uVar2;
  }
  pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)in_ESI);
  uVar2 = pvVar6->sib;
  pvVar6 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)local_1c);
  pvVar6->sib = uVar2;
  return;
}

Assistant:

void delete_sib_(uint32_t node_pos) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto parent_pos = bc_[node_pos].check();
    auto base = bc_[parent_pos].base();
    auto label = static_cast<uint8_t>(base ^ node_pos);

    auto _node_pos = base ^node_links_[parent_pos].child;
    while (node_links_[_node_pos].sib != label) {
      _node_pos = base ^ node_links_[_node_pos].sib;
    }

    if (node_links_[parent_pos].child == node_links_[_node_pos].sib) {
      node_links_[parent_pos].child = node_links_[node_pos].sib;
    }
    node_links_[_node_pos].sib = node_links_[node_pos].sib;
  }